

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Config::Config(Config *this,ConfigData *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IStream *pIVar2;
  ulong uVar3;
  long lVar4;
  pointer pbVar5;
  TestSpecParser parser;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_d8;
  TestSpecParser local_b8;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_48;
  
  (this->super_SharedImpl<Catch::IConfig>).m_rc = 0;
  (this->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__Config_001b0278;
  ConfigData::ConfigData(&this->m_data,data);
  pIVar2 = openStream(this);
  (this->m_stream)._M_ptr = pIVar2;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((data->testsOrTags).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (data->testsOrTags).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    TagAliasRegistry::get();
    paVar1 = &local_b8.m_arg.field_2;
    local_b8.m_arg._M_string_length = 0;
    local_b8.m_arg.field_2._M_local_buf[0] = '\0';
    local_b8.m_currentFilter.m_patterns.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.m_currentFilter.m_patterns.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.m_currentFilter.m_patterns.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.m_testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.m_testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.m_testSpec.m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.m_tagAliases = &TagAliasRegistry::get::instance.super_ITagAliasRegistry;
    pbVar5 = (data->testsOrTags).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_b8.m_arg._M_dataplus._M_p = (pointer)paVar1;
    if ((data->testsOrTags).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        TestSpecParser::parse(&local_b8,(string *)((long)&(pbVar5->_M_dataplus)._M_p + lVar4));
        uVar3 = uVar3 + 1;
        pbVar5 = (data->testsOrTags).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = lVar4 + 0x20;
      } while (uVar3 < (ulong)((long)(data->testsOrTags).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5)
              );
    }
    TestSpecParser::addFilter(&local_b8);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              (&local_d8,&local_b8.m_testSpec.m_filters);
    local_48.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (this->m_testSpec).m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_48.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (this->m_testSpec).m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->m_testSpec).m_filters.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_testSpec).m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_d8.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->m_testSpec).m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_d8.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->m_testSpec).m_filters.
    super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_d8.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_d8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_48);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_d8);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_b8.m_testSpec.m_filters);
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector(&local_b8.m_currentFilter.m_patterns);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.m_arg._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8.m_arg._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

Config( ConfigData const& data )
        :   m_data( data ),
            m_stream( openStream() )
        {
            if( !data.testsOrTags.empty() ) {
                TestSpecParser parser( ITagAliasRegistry::get() );
                for( std::size_t i = 0; i < data.testsOrTags.size(); ++i )
                    parser.parse( data.testsOrTags[i] );
                m_testSpec = parser.testSpec();
            }
        }